

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::VarintSize<false,false,unsigned_int>(uint *data,int n)

{
  uint uVar1;
  uint uVar2;
  int in_ECX;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  
  uVar5 = 0;
  uVar2 = n & 0xffffffe0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = data[uVar5];
    auVar6._0_4_ = -(uint)(-0x7fffff81 < (int)(uVar1 ^ 0x80000000));
    auVar6._4_4_ = -(uint)(-0x7fffc001 < (int)(uVar1 ^ 0x80000000));
    auVar6._8_4_ = -(uint)(-0x7fe00001 < (int)(uVar1 ^ 0x80000000));
    auVar6._12_4_ = -(uint)(-0x70000001 < (int)(uVar1 ^ 0x80000000));
    iVar3 = movmskps(in_ECX,auVar6);
    in_ECX = iVar3 << 2;
    uVar2 = uVar2 + ((uint)(0x4332322132212110 >> ((byte)in_ECX & 0x3f)) & 7);
  }
  for (; (long)uVar4 < (long)n; uVar4 = uVar4 + 1) {
    iVar3 = 0x1f;
    if ((data[uVar4] | 1) != 0) {
      for (; (data[uVar4] | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    uVar2 = uVar2 + (iVar3 * 9 + 0x49U >> 6);
  }
  return (ulong)uVar2;
}

Assistant:

static size_t VarintSize(const T* data, const int n) {
  static_assert(sizeof(T) == 4, "This routine only works for 32 bit integers");
  // is_unsigned<T> => !ZigZag
  static_assert(
      (std::is_unsigned<T>::value ^ ZigZag) || std::is_signed<T>::value,
      "Cannot ZigZag encode unsigned types");
  // is_unsigned<T> => !SignExtended
  static_assert(
      (std::is_unsigned<T>::value ^ SignExtended) || std::is_signed<T>::value,
      "Cannot SignExtended unsigned types");
  static_assert(!(SignExtended && ZigZag),
                "Cannot SignExtended and ZigZag on the same type");
  // This approach is only faster when vectorized, and the vectorized
  // implementation only works in units of the platform's vector width, and is
  // only faster once a certain number of iterations are used. Normally the
  // compiler generates two loops - one partially unrolled vectorized loop that
  // processes big chunks, and a second "epilogue" scalar loop to finish up the
  // remainder. This is done manually here so that the faster scalar
  // implementation is used for small inputs and for the epilogue.
  int vectorN = n & -32;
  uint32_t sum = vectorN;
  uint32_t msb_sum = 0;
  int i = 0;
  for (; i < vectorN; i++) {
    uint32_t x = data[i];
    if (ZigZag) {
      x = WireFormatLite::ZigZagEncode32(x);
    } else if (SignExtended) {
      msb_sum += x >> 31;
    }
    // clang is so smart that it produces optimal SIMD sequence unrolling
    // the loop 8 ints at a time. With a sequence of 4
    // cmpres = cmpgt x, sizeclass  ( -1 or 0)
    // sum = sum - cmpres
    if (x > 0x7F) sum++;
    if (x > 0x3FFF) sum++;
    if (x > 0x1FFFFF) sum++;
    if (x > 0xFFFFFFF) sum++;
  }
#ifdef __clang__
// Clang is not smart enough to see that this loop doesn't run many times
// NOLINTNEXTLINE(google3-runtime-pragma-loop-hint): b/315043579
#pragma clang loop vectorize(disable) unroll(disable) interleave(disable)
#endif
  for (; i < n; i++) {
    uint32_t x = data[i];
    if (ZigZag) {
      sum += WireFormatLite::SInt32Size(x);
    } else if (SignExtended) {
      sum += WireFormatLite::Int32Size(x);
    } else {
      sum += WireFormatLite::UInt32Size(x);
    }
  }
  if (SignExtended) sum += msb_sum * 5;
  return sum;
}